

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O0

int mbedtls_ssl_ticket_write
              (void *p_ticket,mbedtls_ssl_session *session,uchar *start,uchar *end,size_t *tlen,
              uint32_t *ticket_lifetime)

{
  undefined8 uVar1;
  size_t local_98;
  size_t ciph_len;
  size_t clear_len;
  uchar *tag;
  uchar *state;
  uchar *state_len_bytes;
  uchar *iv;
  uchar *key_name;
  mbedtls_ssl_ticket_key *key;
  mbedtls_ssl_ticket_context *ctx;
  uint32_t *puStack_48;
  int ret;
  uint32_t *ticket_lifetime_local;
  size_t *tlen_local;
  uchar *end_local;
  uchar *start_local;
  mbedtls_ssl_session *session_local;
  void *p_ticket_local;
  
  state_len_bytes = start + 4;
  state = start + 0x10;
  tag = start + 0x12;
  *tlen = 0;
  if ((p_ticket == (void *)0x0) || (*(long *)((long)p_ticket + 200) == 0)) {
    p_ticket_local._4_4_ = -0x7100;
  }
  else if ((long)end - (long)start < 0x22) {
    p_ticket_local._4_4_ = -0x6a00;
  }
  else {
    iv = start;
    key = (mbedtls_ssl_ticket_key *)p_ticket;
    puStack_48 = ticket_lifetime;
    ticket_lifetime_local = (uint32_t *)tlen;
    tlen_local = (size_t *)end;
    end_local = start;
    start_local = (uchar *)session;
    session_local = (mbedtls_ssl_session *)p_ticket;
    ctx._4_4_ = ssl_ticket_update_keys((mbedtls_ssl_ticket_context *)p_ticket);
    if (ctx._4_4_ == 0) {
      key_name = key[key[2].name[0]].name;
      *puStack_48 = key[2].generation_time;
      *(undefined4 *)iv = *(undefined4 *)((mbedtls_ssl_ticket_key *)key_name)->name;
      uVar1._0_4_ = key[2].ctx.key_bitlen;
      uVar1._4_4_ = key[2].ctx.operation;
      ctx._4_4_ = (*(code *)key[2].ctx.cipher_info)(uVar1,state_len_bytes,0xc);
      if (((ctx._4_4_ == 0) &&
          (ctx._4_4_ = ssl_save_session((mbedtls_ssl_session *)start_local,tag,
                                        (long)tlen_local - (long)tag,&ciph_len), ctx._4_4_ == 0)) &&
         (ciph_len < 0x10000)) {
        *state = (uchar)(ciph_len >> 8);
        state[1] = (uchar)ciph_len;
        clear_len = (size_t)(tag + ciph_len);
        ctx._4_4_ = mbedtls_cipher_auth_encrypt
                              ((mbedtls_cipher_context_t *)(key_name + 8),state_len_bytes,0xc,iv,
                               0x12,tag,ciph_len,tag,&local_98,(uchar *)clear_len,0x10);
        if (ctx._4_4_ == 0) {
          if (local_98 == ciph_len) {
            *(size_t *)ticket_lifetime_local = local_98 + 0x22;
          }
          else {
            ctx._4_4_ = -0x6c00;
          }
        }
      }
    }
    p_ticket_local._4_4_ = ctx._4_4_;
  }
  return p_ticket_local._4_4_;
}

Assistant:

int mbedtls_ssl_ticket_write( void *p_ticket,
                              const mbedtls_ssl_session *session,
                              unsigned char *start,
                              const unsigned char *end,
                              size_t *tlen,
                              uint32_t *ticket_lifetime )
{
    int ret;
    mbedtls_ssl_ticket_context *ctx = p_ticket;
    mbedtls_ssl_ticket_key *key;
    unsigned char *key_name = start;
    unsigned char *iv = start + 4;
    unsigned char *state_len_bytes = iv + 12;
    unsigned char *state = state_len_bytes + 2;
    unsigned char *tag;
    size_t clear_len, ciph_len;

    *tlen = 0;

    if( ctx == NULL || ctx->f_rng == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /* We need at least 4 bytes for key_name, 12 for IV, 2 for len 16 for tag,
     * in addition to session itself, that will be checked when writing it. */
    if( end - start < 4 + 12 + 2 + 16 )
        return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    if( ( ret = ssl_ticket_update_keys( ctx ) ) != 0 )
        goto cleanup;

    key = &ctx->keys[ctx->active];

    *ticket_lifetime = ctx->ticket_lifetime;

    memcpy( key_name, key->name, 4 );

    if( ( ret = ctx->f_rng( ctx->p_rng, iv, 12 ) ) != 0 )
        goto cleanup;

    /* Dump session state */
    if( ( ret = ssl_save_session( session,
                                  state, end - state, &clear_len ) ) != 0 ||
        (unsigned long) clear_len > 65535 )
    {
         goto cleanup;
    }
    state_len_bytes[0] = ( clear_len >> 8 ) & 0xff;
    state_len_bytes[1] = ( clear_len      ) & 0xff;

    /* Encrypt and authenticate */
    tag = state + clear_len;
    if( ( ret = mbedtls_cipher_auth_encrypt( &key->ctx,
                    iv, 12, key_name, 4 + 12 + 2,
                    state, clear_len, state, &ciph_len, tag, 16 ) ) != 0 )
    {
        goto cleanup;
    }
    if( ciph_len != clear_len )
    {
        ret = MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        goto cleanup;
    }

    *tlen = 4 + 12 + 2 + 16 + ciph_len;

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}